

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O2

void duckdb::MapFunction(DataChunk *args,ExpressionState *param_2,Vector *result)

{
  UnifiedVectorFormat *pUVar1;
  long lVar2;
  char cVar3;
  reference pvVar4;
  reference pvVar5;
  Vector *pVVar6;
  UnifiedVectorFormat *pUVar7;
  list_entry_t *plVar8;
  UnifiedVectorFormat *pUVar9;
  Vector *pVVar10;
  UnifiedVectorFormat *pUVar11;
  ulong uVar12;
  ulong uVar13;
  idx_t count;
  ulong uVar14;
  VectorType VVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  bool bVar19;
  __ireturn_type _Var20;
  ulong local_378;
  UnifiedVectorFormat *local_370;
  SelectionVector sel_values;
  SelectionVector sel_keys;
  value_set_t unique_keys;
  UnifiedVectorFormat values_data;
  long local_2a0;
  long local_298;
  UnifiedVectorFormat keys_data;
  long local_258;
  long local_250;
  UnifiedVectorFormat result_data;
  long local_210;
  UnifiedVectorFormat keys_child_data;
  long local_1c0;
  UnifiedVectorFormat values_child_data;
  Vector keys_child_vector;
  Vector values_child_vector;
  Value value;
  
  VVar15 = (VectorType)result;
  if (*(long *)args != *(long *)(args + 8)) {
    pvVar4 = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)args,0);
    pvVar5 = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)args,1);
    if ((pvVar4[8] == (value_type)0x1) || (pvVar5[8] == (value_type)0x1)) {
      FlatVector::VerifyFlatVector(result);
      TemplatedValidityMask<unsigned_long>::SetInvalid
                ((TemplatedValidityMask<unsigned_long> *)(result + 0x28),0);
      duckdb::Vector::SetVectorType(VVar15);
      return;
    }
    pUVar1 = *(UnifiedVectorFormat **)(args + 0x18);
    if (*(long *)args != *(long *)(args + 8)) {
      pvVar4 = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)args,0);
      pvVar5 = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)args,1);
      duckdb::UnifiedVectorFormat::UnifiedVectorFormat(&keys_data);
      duckdb::Vector::ToUnifiedFormat((ulong)pvVar4,pUVar1);
      pVVar6 = (Vector *)duckdb::ListVector::GetEntry(pvVar4);
      duckdb::Vector::Vector(&keys_child_vector,pVVar6);
      duckdb::UnifiedVectorFormat::UnifiedVectorFormat(&keys_child_data);
      pUVar7 = (UnifiedVectorFormat *)duckdb::ListVector::GetListSize(pvVar4);
      duckdb::Vector::ToUnifiedFormat((ulong)&keys_child_vector,pUVar7);
      duckdb::UnifiedVectorFormat::UnifiedVectorFormat(&values_data);
      duckdb::Vector::ToUnifiedFormat((ulong)pvVar5,pUVar1);
      pVVar6 = (Vector *)duckdb::ListVector::GetEntry(pvVar5);
      duckdb::Vector::Vector(&values_child_vector,pVVar6);
      duckdb::UnifiedVectorFormat::UnifiedVectorFormat(&values_child_data);
      pUVar7 = (UnifiedVectorFormat *)duckdb::ListVector::GetListSize(pvVar5);
      duckdb::Vector::ToUnifiedFormat((ulong)&values_child_vector,pUVar7);
      duckdb::UnifiedVectorFormat::UnifiedVectorFormat(&result_data);
      duckdb::Vector::ToUnifiedFormat((ulong)result,pUVar1);
      FlatVector::VerifyFlatVector(result);
      count = 0;
      for (pUVar7 = (UnifiedVectorFormat *)0x0; pUVar1 != pUVar7; pUVar7 = pUVar7 + 1) {
        pUVar9 = pUVar7;
        if (*_keys_data != 0) {
          pUVar9 = (UnifiedVectorFormat *)(ulong)*(uint *)(*_keys_data + (long)pUVar7 * 4);
        }
        pUVar11 = pUVar7;
        if (*_values_data != 0) {
          pUVar11 = (UnifiedVectorFormat *)(ulong)*(uint *)(*_values_data + (long)pUVar7 * 4);
        }
        if (((local_250 == 0) ||
            ((*(ulong *)(local_250 + ((ulong)pUVar9 >> 6) * 8) >> ((ulong)pUVar9 & 0x3f) & 1) != 0))
           && ((local_298 == 0 ||
               ((*(ulong *)(local_298 + ((ulong)pUVar11 >> 6) * 8) >> ((ulong)pUVar11 & 0x3f) & 1)
                != 0)))) {
          count = count + *(long *)(local_258 + 8 + (long)pUVar9 * 0x10);
        }
      }
      SelectionVector::SelectionVector(&sel_keys,count);
      SelectionVector::SelectionVector(&sel_values,count);
      local_378 = 0;
      for (pUVar7 = (UnifiedVectorFormat *)0x0; pUVar7 != pUVar1; pUVar7 = pUVar7 + 1) {
        pUVar9 = pUVar7;
        if (*_keys_data != 0) {
          pUVar9 = (UnifiedVectorFormat *)(ulong)*(uint *)(*_keys_data + (long)pUVar7 * 4);
        }
        pUVar11 = pUVar7;
        if (*_values_data != 0) {
          pUVar11 = (UnifiedVectorFormat *)(ulong)*(uint *)(*_values_data + (long)pUVar7 * 4);
        }
        local_370 = pUVar7;
        if (*_result_data != 0) {
          local_370 = (UnifiedVectorFormat *)(ulong)*(uint *)(*_result_data + (long)pUVar7 * 4);
        }
        if (((local_250 == 0) ||
            ((*(ulong *)(local_250 + ((ulong)pUVar9 >> 6) * 8) >> ((ulong)pUVar9 & 0x3f) & 1) != 0))
           && ((local_298 == 0 ||
               ((*(ulong *)(local_298 + ((ulong)pUVar11 >> 6) * 8) >> ((ulong)pUVar11 & 0x3f) & 1)
                != 0)))) {
          uVar13 = *(ulong *)(local_258 + (long)pUVar9 * 0x10);
          lVar2 = *(long *)(local_258 + 8 + (long)pUVar9 * 0x10);
          uVar14 = *(ulong *)(local_2a0 + (long)pUVar11 * 0x10);
          if (lVar2 != *(long *)(local_2a0 + 8 + (long)pUVar11 * 0x10)) {
            duckdb::MapVector::EvalMapInvalidReason(NOT_ALIGNED);
          }
          unique_keys._M_h._M_buckets = &unique_keys._M_h._M_single_bucket;
          unique_keys._M_h._M_bucket_count = 1;
          unique_keys._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
          unique_keys._M_h._M_element_count = 0;
          unique_keys._M_h._M_rehash_policy._M_max_load_factor = 1.0;
          unique_keys._M_h._M_rehash_policy._M_next_resize = 0;
          unique_keys._M_h._M_single_bucket = (__node_base_ptr)0x0;
          uVar16 = local_378;
          lVar18 = lVar2;
          while (bVar19 = lVar18 != 0, lVar18 = lVar18 + -1, bVar19) {
            uVar17 = uVar13;
            if (*_keys_child_data != 0) {
              uVar17 = (ulong)*(uint *)(*_keys_child_data + uVar13 * 4);
            }
            uVar12 = uVar14;
            if (*_values_child_data != 0) {
              uVar12 = (ulong)*(uint *)(*_values_child_data + uVar14 * 4);
            }
            if ((local_1c0 != 0) &&
               ((*(ulong *)(local_1c0 + (uVar17 >> 6) * 8) >> (uVar17 & 0x3f) & 1) == 0)) {
              duckdb::MapVector::EvalMapInvalidReason(NULL_KEY);
            }
            duckdb::Vector::GetValue((ulong)&value);
            _Var20 = std::__detail::
                     _Insert_base<duckdb::Value,_duckdb::Value,_std::allocator<duckdb::Value>,_std::__detail::_Identity,_duckdb::ValueEquality,_duckdb::ValueHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     ::insert((_Insert_base<duckdb::Value,_duckdb::Value,_std::allocator<duckdb::Value>,_std::__detail::_Identity,_duckdb::ValueEquality,_duckdb::ValueHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                               *)&unique_keys,&value);
            if (((undefined1  [16])_Var20 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
              duckdb::MapVector::EvalMapInvalidReason(DUPLICATE_KEY);
            }
            sel_keys.sel_vector[uVar16] = (sel_t)uVar17;
            sel_values.sel_vector[uVar16] = (sel_t)uVar12;
            duckdb::Value::~Value(&value);
            uVar13 = uVar13 + 1;
            uVar14 = uVar14 + 1;
            uVar16 = uVar16 + 1;
          }
          *(long *)(local_210 + 8 + (long)local_370 * 0x10) = lVar2;
          *(ulong *)(local_210 + (long)local_370 * 0x10) = local_378;
          local_378 = local_378 + lVar2;
          std::
          _Hashtable<duckdb::Value,_duckdb::Value,_std::allocator<duckdb::Value>,_std::__detail::_Identity,_duckdb::ValueEquality,_duckdb::ValueHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::~_Hashtable(&unique_keys._M_h);
        }
        else {
          TemplatedValidityMask<unsigned_long>::SetInvalid
                    ((TemplatedValidityMask<unsigned_long> *)(result + 0x28),(idx_t)pUVar7);
        }
      }
      pVVar6 = (Vector *)duckdb::MapVector::GetKeys(result);
      pVVar10 = (Vector *)duckdb::MapVector::GetValues(result);
      duckdb::ListVector::SetListSize(result,local_378);
      duckdb::Vector::Slice(pVVar6,(SelectionVector *)&keys_child_vector,(ulong)&sel_keys);
      duckdb::Vector::Flatten((ulong)pVVar6);
      duckdb::Vector::Slice(pVVar10,(SelectionVector *)&values_child_vector,(ulong)&sel_values);
      duckdb::Vector::Flatten((ulong)pVVar10);
      pVVar6 = (Vector *)duckdb::ListVector::GetEntry(result);
      FlatVector::VerifyFlatVector(pVVar6);
      duckdb::ValidityMask::Resize((ulong)(pVVar6 + 0x28));
      cVar3 = duckdb::DataChunk::AllConstant();
      if (cVar3 != '\0') {
        duckdb::Vector::SetVectorType(VVar15);
      }
      duckdb::Vector::Verify((ulong)result);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&sel_values.selection_data.internal.
                  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
      ;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&sel_keys.selection_data.internal.
                  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
      ;
      UnifiedVectorFormat::~UnifiedVectorFormat(&result_data);
      UnifiedVectorFormat::~UnifiedVectorFormat(&values_child_data);
      Vector::~Vector(&values_child_vector);
      UnifiedVectorFormat::~UnifiedVectorFormat(&values_data);
      UnifiedVectorFormat::~UnifiedVectorFormat(&keys_child_data);
      Vector::~Vector(&keys_child_vector);
      UnifiedVectorFormat::~UnifiedVectorFormat(&keys_data);
      return;
    }
  }
  duckdb::Vector::SetVectorType(VVar15);
  duckdb::ListVector::SetListSize(result,0);
  plVar8 = ListVector::GetData(result);
  plVar8->offset = 0;
  plVar8->length = 0;
  duckdb::Vector::Verify((ulong)result);
  return;
}

Assistant:

static void MapFunction(DataChunk &args, ExpressionState &, Vector &result) {

	// internal MAP representation
	// - LIST-vector that contains STRUCTs as child entries
	// - STRUCTs have exactly two fields, a key-field, and a value-field
	// - key names are unique
	D_ASSERT(result.GetType().id() == LogicalTypeId::MAP);

	if (MapIsNull(args)) {
		auto &validity = FlatVector::Validity(result);
		validity.SetInvalid(0);
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
		return;
	}

	auto row_count = args.size();

	// early-out, if no data
	if (args.data.empty()) {
		return MapFunctionEmptyInput(result, row_count);
	}

	auto &keys = args.data[0];
	auto &values = args.data[1];

	// a LIST vector, where each row contains a LIST of KEYS
	UnifiedVectorFormat keys_data;
	keys.ToUnifiedFormat(row_count, keys_data);
	auto keys_entries = UnifiedVectorFormat::GetData<list_entry_t>(keys_data);

	// the KEYs child vector
	auto keys_child_vector = ListVector::GetEntry(keys);
	UnifiedVectorFormat keys_child_data;
	keys_child_vector.ToUnifiedFormat(ListVector::GetListSize(keys), keys_child_data);

	// a LIST vector, where each row contains a LIST of VALUES
	UnifiedVectorFormat values_data;
	values.ToUnifiedFormat(row_count, values_data);
	auto values_entries = UnifiedVectorFormat::GetData<list_entry_t>(values_data);

	// the VALUEs child vector
	auto values_child_vector = ListVector::GetEntry(values);
	UnifiedVectorFormat values_child_data;
	values_child_vector.ToUnifiedFormat(ListVector::GetListSize(values), values_child_data);

	// a LIST vector, where each row contains a MAP (LIST of STRUCTs)
	UnifiedVectorFormat result_data;
	result.ToUnifiedFormat(row_count, result_data);
	auto result_entries = UnifiedVectorFormat::GetDataNoConst<list_entry_t>(result_data);

	auto &result_validity = FlatVector::Validity(result);

	// get the resulting size of the key/value child lists
	idx_t result_child_size = 0;
	for (idx_t row_idx = 0; row_idx < row_count; row_idx++) {
		auto keys_idx = keys_data.sel->get_index(row_idx);
		auto values_idx = values_data.sel->get_index(row_idx);
		if (!keys_data.validity.RowIsValid(keys_idx) || !values_data.validity.RowIsValid(values_idx)) {
			continue;
		}
		auto keys_entry = keys_entries[keys_idx];
		result_child_size += keys_entry.length;
	}

	// we need to slice potential non-flat vectors
	SelectionVector sel_keys(result_child_size);
	SelectionVector sel_values(result_child_size);
	idx_t offset = 0;

	for (idx_t row_idx = 0; row_idx < row_count; row_idx++) {

		auto keys_idx = keys_data.sel->get_index(row_idx);
		auto values_idx = values_data.sel->get_index(row_idx);
		auto result_idx = result_data.sel->get_index(row_idx);

		// NULL MAP
		if (!keys_data.validity.RowIsValid(keys_idx) || !values_data.validity.RowIsValid(values_idx)) {
			result_validity.SetInvalid(row_idx);
			continue;
		}

		auto keys_entry = keys_entries[keys_idx];
		auto values_entry = values_entries[values_idx];

		if (keys_entry.length != values_entry.length) {
			MapVector::EvalMapInvalidReason(MapInvalidReason::NOT_ALIGNED);
		}

		// set the selection vectors and perform a duplicate key check
		value_set_t unique_keys;
		for (idx_t child_idx = 0; child_idx < keys_entry.length; child_idx++) {

			auto key_idx = keys_child_data.sel->get_index(keys_entry.offset + child_idx);
			auto value_idx = values_child_data.sel->get_index(values_entry.offset + child_idx);

			// NULL check
			if (!keys_child_data.validity.RowIsValid(key_idx)) {
				MapVector::EvalMapInvalidReason(MapInvalidReason::NULL_KEY);
			}

			// unique check
			auto value = keys_child_vector.GetValue(key_idx);
			auto unique = unique_keys.insert(value).second;
			if (!unique) {
				MapVector::EvalMapInvalidReason(MapInvalidReason::DUPLICATE_KEY);
			}

			// set selection vectors
			sel_keys.set_index(offset + child_idx, key_idx);
			sel_values.set_index(offset + child_idx, value_idx);
		}

		// keys_entry and values_entry have the same length
		result_entries[result_idx].length = keys_entry.length;
		result_entries[result_idx].offset = offset;
		offset += keys_entry.length;
	}
	D_ASSERT(offset == result_child_size);

	auto &result_key_vector = MapVector::GetKeys(result);
	auto &result_value_vector = MapVector::GetValues(result);

	ListVector::SetListSize(result, offset);
	result_key_vector.Slice(keys_child_vector, sel_keys, offset);
	result_key_vector.Flatten(offset);
	result_value_vector.Slice(values_child_vector, sel_values, offset);
	result_value_vector.Flatten(offset);
	FlatVector::Validity(ListVector::GetEntry(result)).Resize(result_child_size);

	if (args.AllConstant()) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
	}
	result.Verify(row_count);
}